

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall parser::loadActionMap(parser *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  *local_308;
  actions local_2f8 [19];
  actions local_2ac;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  *local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_48;
  iterator local_20;
  undefined8 local_18;
  parser *local_10;
  parser *this_local;
  
  local_2a8 = &local_2a0;
  local_2ac = GO;
  local_10 = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[3],_actions,_true>(local_2a8,(char (*) [3])"go",&local_2ac);
  local_2a8 = &local_278;
  local_2f8[0xe] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(local_2a8,(char (*) [6])"throw",local_2f8 + 0xe);
  local_2a8 = &local_250;
  local_2f8[0xd] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"look",local_2f8 + 0xd);
  local_2a8 = &local_228;
  local_2f8[0xc] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[8],_actions,_true>(local_2a8,(char (*) [8])"examine",local_2f8 + 0xc);
  local_2a8 = &local_200;
  local_2f8[0xb] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"rest",local_2f8 + 0xb);
  local_2a8 = &local_1d8;
  local_2f8[10] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(local_2a8,(char (*) [6])"touch",local_2f8 + 10);
  local_2a8 = &local_1b0;
  local_2f8[9] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[7],_actions,_true>(local_2a8,(char (*) [7])"pickup",local_2f8 + 9);
  local_2a8 = &local_188;
  local_2f8[8] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"pick",local_2f8 + 8);
  local_2a8 = &local_160;
  local_2f8[7] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"drop",local_2f8 + 7);
  local_2a8 = &local_138;
  local_2f8[6] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[4],_actions,_true>(local_2a8,(char (*) [4])"use",local_2f8 + 6);
  local_2a8 = &local_110;
  local_2f8[5] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"open",local_2f8 + 5);
  local_2a8 = &local_e8;
  local_2f8[4] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(local_2a8,(char (*) [6])"close",local_2f8 + 4);
  local_2a8 = &local_c0;
  local_2f8[3] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"help",local_2f8 + 3);
  local_2a8 = &local_98;
  local_2f8[2] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[1],_actions,_true>(local_2a8,(char (*) [1])0x145e25,local_2f8 + 2);
  local_2a8 = &local_70;
  local_2f8[1] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"quit",local_2f8 + 1);
  local_2a8 = &local_48;
  local_2f8[0] = EXIT;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(local_2a8,(char (*) [5])"exit",local_2f8);
  local_20 = &local_2a0;
  local_18 = 0x10;
  __l._M_len = 0x10;
  __l._M_array = local_20;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>_>_>
  ::operator=(&this->actionMap,__l);
  local_308 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
               *)&local_20;
  do {
    local_308 = local_308 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
    ::~pair(local_308);
  } while (local_308 != &local_2a0);
  return;
}

Assistant:

void parser::loadActionMap() {
    actionMap = {
            {"go", GO},
            {"throw", THROW},
            {"look", LOOK},
            {"examine", LOOK},
            {"rest", REST},
            {"touch", TOUCH},
            {"pickup", PICK},
            {"pick", PICK},
            {"drop", DROP},
            {"use", USE},
            {"open", OPEN},
            {"close", OPEN},
            {"help", HELP},
            {"", NO_ACTION},
            {"quit", EXIT},
            {"exit", EXIT}
    };
}